

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

char * __thiscall
flatbuffers::JsonPrinter::GenStruct(JsonPrinter *this,StructDef *struct_def,Table *table,int indent)

{
  ushort uVar1;
  FieldDef *fd;
  int iVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  pointer ppFVar6;
  Table *prev_val;
  bool bVar7;
  
  std::__cxx11::string::push_back((char)this->text);
  iVar2 = this->opts->indent_step;
  prev_val = (Table *)0x0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar2 = iVar2 + indent;
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar5 = 0;
  do {
    if (ppFVar6 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      AddNewLine(this);
      AddIndent(this,indent);
      std::__cxx11::string::push_back((char)this->text);
      return (char *)0x0;
    }
    fd = *ppFVar6;
    bVar7 = true;
    if (struct_def->fixed == false) {
      uVar1 = (fd->value).offset;
      if (uVar1 < *(ushort *)(table + -(long)*(int *)table)) {
        bVar7 = *(short *)(table + ((ulong)uVar1 - (long)*(int *)table)) != 0;
      }
      else {
        bVar7 = false;
      }
    }
    if (((this->opts->output_default_scalars_in_json == false) && (fd->key != true)) ||
       (0xb < (fd->value).type.base_type - BASE_TYPE_UTYPE)) {
      bVar4 = 0;
    }
    else {
      bVar4 = fd->deprecated ^ 1;
    }
    if (bVar7 || (bVar4 & 1) != 0) {
      if (iVar5 != 0) {
        AddComma(this);
      }
      AddNewLine(this);
      AddIndent(this,iVar2);
      OutputIdentifier(this,(string *)fd);
      if ((this->opts->protobuf_ascii_alike != true) ||
         (((fd->value).type.base_type & ~BASE_TYPE_UTYPE) != BASE_TYPE_VECTOR)) {
        std::__cxx11::string::push_back((char)this->text);
      }
      std::__cxx11::string::push_back((char)this->text);
      switch((fd->value).type.base_type) {
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE:
      case BASE_TYPE_BOOL:
      case BASE_TYPE_UCHAR:
        GenField<unsigned_char>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_CHAR:
        GenField<signed_char>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_SHORT:
        GenField<short>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_USHORT:
        GenField<unsigned_short>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_INT:
        GenField<int>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_UINT:
        GenField<unsigned_int>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_LONG:
        GenField<long>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_ULONG:
        GenField<unsigned_long>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_FLOAT:
        GenField<float>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_DOUBLE:
        GenField<double>(this,fd,table,struct_def->fixed,iVar2);
        break;
      case BASE_TYPE_STRING:
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_STRUCT:
      case BASE_TYPE_UNION:
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR64:
        pcVar3 = GenFieldOffset(this,fd,table,struct_def->fixed,iVar2,(uint8_t *)prev_val);
        if (pcVar3 != (char *)0x0) {
          return pcVar3;
        }
      }
      iVar5 = iVar5 + 1;
      uVar1 = (fd->value).offset;
      if (struct_def->fixed == true) {
        prev_val = table + uVar1;
      }
      else {
        prev_val = (Table *)Table::GetAddressOf(table,uVar1);
      }
    }
    ppFVar6 = ppFVar6 + 1;
  } while( true );
}

Assistant:

const char *GenStruct(const StructDef &struct_def, const Table *table,
                        int indent) {
    text += '{';
    int fieldout = 0;
    const uint8_t *prev_val = nullptr;
    const auto elem_indent = indent + Indent();
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      FieldDef &fd = **it;
      auto is_present = struct_def.fixed || table->CheckField(fd.value.offset);
      auto output_anyway = (opts.output_default_scalars_in_json || fd.key) &&
                           IsScalar(fd.value.type.base_type) && !fd.deprecated;
      if (is_present || output_anyway) {
        if (fieldout++) { AddComma(); }
        AddNewLine();
        AddIndent(elem_indent);
        OutputIdentifier(fd.name);
        if (!opts.protobuf_ascii_alike ||
            (fd.value.type.base_type != BASE_TYPE_STRUCT &&
             fd.value.type.base_type != BASE_TYPE_VECTOR))
          text += ':';
        text += ' ';
        // clang-format off
        switch (fd.value.type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            GenField<CTYPE>(fd, table, struct_def.fixed, elem_indent); \
            break; }
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, ...) \
          case BASE_TYPE_ ## ENUM:
              FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
              FLATBUFFERS_GEN_TYPE_ARRAY(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            {
              auto err = GenFieldOffset(fd, table, struct_def.fixed, elem_indent, prev_val);
              if (err) return err;
              break;
            }
        }
        // clang-format on
        // Track prev val for use with union types.
        if (struct_def.fixed) {
          prev_val = reinterpret_cast<const uint8_t *>(table) + fd.value.offset;
        } else {
          prev_val = table->GetAddressOf(fd.value.offset);
        }
      }
    }
    AddNewLine();
    AddIndent(indent);
    text += '}';
    return nullptr;
  }